

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,llvm::RelocAddrEntry,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::RelocAddrEntry>>,unsigned_long,llvm::RelocAddrEntry,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::RelocAddrEntry>>
::
copyFrom<llvm::DenseMap<unsigned_long,llvm::RelocAddrEntry,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::RelocAddrEntry>>>
          (DenseMapBase<llvm::DenseMap<unsigned_long,llvm::RelocAddrEntry,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::RelocAddrEntry>>,unsigned_long,llvm::RelocAddrEntry,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::RelocAddrEntry>>
           *this,DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>,_unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>
                 *other)

{
  if (other == (DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>,_unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>
                *)this) {
    __assert_fail("&other != this",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                  ,0x189,
                  "void llvm::DenseMapBase<llvm::DenseMap<unsigned long, llvm::RelocAddrEntry>, unsigned long, llvm::RelocAddrEntry, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseMapPair<unsigned long, llvm::RelocAddrEntry>>::copyFrom(const DenseMapBase<OtherBaseT, KeyT, ValueT, KeyInfoT, BucketT> &) [DerivedT = llvm::DenseMap<unsigned long, llvm::RelocAddrEntry>, KeyT = unsigned long, ValueT = llvm::RelocAddrEntry, KeyInfoT = llvm::DenseMapInfo<unsigned long>, BucketT = llvm::detail::DenseMapPair<unsigned long, llvm::RelocAddrEntry>, OtherBaseT = llvm::DenseMap<unsigned long, llvm::RelocAddrEntry>]"
                 );
  }
  if (*(uint *)(this + 0x10) == *(uint *)(other + 0x10)) {
    *(undefined8 *)(this + 8) = *(undefined8 *)(other + 8);
    memcpy(*(void **)this,*(void **)other,(ulong)*(uint *)(this + 0x10) * 0x50);
    return;
  }
  __assert_fail("getNumBuckets() == other.getNumBuckets()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                ,0x18a,
                "void llvm::DenseMapBase<llvm::DenseMap<unsigned long, llvm::RelocAddrEntry>, unsigned long, llvm::RelocAddrEntry, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseMapPair<unsigned long, llvm::RelocAddrEntry>>::copyFrom(const DenseMapBase<OtherBaseT, KeyT, ValueT, KeyInfoT, BucketT> &) [DerivedT = llvm::DenseMap<unsigned long, llvm::RelocAddrEntry>, KeyT = unsigned long, ValueT = llvm::RelocAddrEntry, KeyInfoT = llvm::DenseMapInfo<unsigned long>, BucketT = llvm::detail::DenseMapPair<unsigned long, llvm::RelocAddrEntry>, OtherBaseT = llvm::DenseMap<unsigned long, llvm::RelocAddrEntry>]"
               );
}

Assistant:

void copyFrom(
      const DenseMapBase<OtherBaseT, KeyT, ValueT, KeyInfoT, BucketT> &other) {
    assert(&other != this);
    assert(getNumBuckets() == other.getNumBuckets());

    setNumEntries(other.getNumEntries());
    setNumTombstones(other.getNumTombstones());

    if (is_trivially_copyable<KeyT>::value &&
        is_trivially_copyable<ValueT>::value)
      memcpy(reinterpret_cast<void *>(getBuckets()), other.getBuckets(),
             getNumBuckets() * sizeof(BucketT));
    else
      for (size_t i = 0; i < getNumBuckets(); ++i) {
        ::new (&getBuckets()[i].getFirst())
            KeyT(other.getBuckets()[i].getFirst());
        if (!KeyInfoT::isEqual(getBuckets()[i].getFirst(), getEmptyKey()) &&
            !KeyInfoT::isEqual(getBuckets()[i].getFirst(), getTombstoneKey()))
          ::new (&getBuckets()[i].getSecond())
              ValueT(other.getBuckets()[i].getSecond());
      }
  }